

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long *plVar1;
  data_ptr_t pdVar2;
  long *plVar3;
  idx_t size;
  Vector *pVVar4;
  idx_t iVar5;
  idx_t iVar6;
  long lVar7;
  undefined8 *puVar8;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(state_vector,count,&local_68);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(local_68.sel)->sel_vector[iVar5];
      }
      if (**(long **)(local_68.data + iVar6 * 8) != 0) {
        lVar7 = lVar7 + *(long *)(**(long **)(local_68.data + iVar6 * 8) + 0x18);
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  ListVector::Reserve(result,lVar7 + size);
  pVVar4 = ListVector::GetEntry(result);
  if (count != 0) {
    pdVar2 = result->data;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(local_68.sel)->sel_vector[iVar5];
      }
      plVar3 = *(long **)(local_68.data + iVar6 * 8);
      plVar1 = (long *)(pdVar2 + iVar5 * 0x10);
      *(idx_t *)(pdVar2 + iVar5 * 0x10) = size;
      if (*plVar3 == 0) {
        lVar7 = 0;
      }
      else {
        for (puVar8 = *(undefined8 **)(*plVar3 + 0x10); puVar8 != (undefined8 *)0x0;
            puVar8 = (undefined8 *)*puVar8) {
          pVVar4->data[size] = *(data_t *)(puVar8 + 1);
          size = size + 1;
        }
        lVar7 = size - *plVar1;
      }
      plVar1[1] = lVar7;
      iVar5 = iVar5 + 1;
    } while (iVar5 != count);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}